

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::CompareEdgeDirections(S2Point *a0,S2Point *a1,S2Point *b0,S2Point *b1)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  double *ap;
  bool bVar5;
  undefined1 *puStack_f0;
  undefined1 local_e8 [16];
  longdouble local_d8;
  undefined1 local_c8 [16];
  Vector3_xf local_b8;
  Vector3_xf local_88;
  Vector3_xf local_58;
  
  local_e8._10_6_ = (uint6)((ulong)a1->c_[1] >> 0x10) ^ 0x800000000000;
  local_e8._0_8_ = -a1->c_[0];
  local_e8._8_2_ = SUB82(a1->c_[1],0);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,-a1->c_[2]);
  lVar4 = 0;
  do {
    dVar1 = *(double *)((long)a0->c_ + lVar4);
    dVar2 = *(double *)(local_e8 + lVar4);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar5 = lVar4 != 0x10;
    lVar4 = lVar4 + 8;
  } while (bVar5);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    local_e8._10_6_ = (uint6)((ulong)b1->c_[1] >> 0x10) ^ 0x800000000000;
    local_e8._0_8_ = -b1->c_[0];
    local_e8._8_2_ = SUB82(b1->c_[1],0);
    local_d8 = (longdouble)CONCAT28(local_d8._8_2_,-b1->c_[2]);
    lVar4 = 0;
    do {
      dVar1 = *(double *)((long)b0->c_ + lVar4);
      dVar2 = *(double *)(local_e8 + lVar4);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar5 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      puStack_f0 = (undefined1 *)0x214cc7;
      iVar3 = TriageCompareEdgeDirections<double>(a0,a1,b0,b1);
      if (iVar3 == 0) {
        lVar4 = 0;
        do {
          dVar1 = *(double *)((long)a0->c_ + lVar4);
          dVar2 = *(double *)((long)a1->c_ + lVar4);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar5 = lVar4 != 0x10;
          lVar4 = lVar4 + 8;
        } while (bVar5);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          lVar4 = 0;
          do {
            dVar1 = *(double *)((long)b0->c_ + lVar4);
            dVar2 = *(double *)((long)b1->c_ + lVar4);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar5 = lVar4 != 0x10;
            lVar4 = lVar4 + 8;
          } while (bVar5);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            local_d8 = (longdouble)a0->c_[1];
            local_c8._0_10_ = (unkbyte10)a0->c_[2];
            local_e8._0_8_ = SUB108((longdouble)a0->c_[0],0);
            local_e8._8_2_ = (undefined2)((unkuint10)(longdouble)a0->c_[0] >> 0x40);
            local_b8.c_[1]._0_10_ = (BADTYPE)a1->c_[1];
            local_b8.c_[2]._0_10_ = (BADTYPE)a1->c_[2];
            local_b8.c_[0]._0_8_ = SUB108((longdouble)a1->c_[0],0);
            local_b8.c_[0].bn_.bn_._0_2_ = (undefined2)((unkuint10)(longdouble)a1->c_[0] >> 0x40);
            local_58.c_[0]._0_10_ = (BADTYPE)b0->c_[0];
            local_58.c_[1]._0_10_ = (BADTYPE)b0->c_[1];
            local_58.c_[2]._0_10_ = (BADTYPE)b0->c_[2];
            local_88.c_[0]._0_10_ = (BADTYPE)b1->c_[0];
            local_88.c_[1]._0_10_ = (BADTYPE)b1->c_[1];
            local_88.c_[2]._0_10_ = (BADTYPE)b1->c_[2];
            puStack_f0 = (undefined1 *)0x214dc1;
            iVar3 = TriageCompareEdgeDirections<long_double>
                              ((Vector3<long_double> *)local_e8,(Vector3<long_double> *)&local_b8,
                               (Vector3<long_double> *)&local_58,(Vector3<long_double> *)&local_88);
            if (iVar3 != 0) {
              return iVar3;
            }
            puStack_f0 = (undefined1 *)0x214dd4;
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (local_e8,(BasicVector<Vector3,ExactFloat,3ul> *)a0);
            puStack_f0 = (undefined1 *)0x214de1;
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_b8,(BasicVector<Vector3,ExactFloat,3ul> *)a1);
            puStack_f0 = (undefined1 *)0x214df1;
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_58,(BasicVector<Vector3,ExactFloat,3ul> *)b0);
            puStack_f0 = (undefined1 *)0x214dfe;
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_88,(BasicVector<Vector3,ExactFloat,3ul> *)b1);
            puStack_f0 = (undefined1 *)0x214e18;
            iVar3 = ExactCompareEdgeDirections((Vector3_xf *)local_e8,&local_b8,&local_58,&local_88)
            ;
            lVar4 = 0x30;
            do {
              puStack_f0 = (undefined1 *)0x214e29;
              BN_free(*(BIGNUM **)((long)&local_b8.c_[2].bn_.bn_ + lVar4));
              lVar4 = lVar4 + -0x10;
            } while (lVar4 != 0);
            lVar4 = 0x30;
            do {
              puStack_f0 = (undefined1 *)0x214e41;
              BN_free(*(BIGNUM **)((long)&local_88.c_[2].bn_.bn_ + lVar4));
              lVar4 = lVar4 + -0x10;
            } while (lVar4 != 0);
            lVar4 = 0x30;
            do {
              puStack_f0 = (undefined1 *)0x214e56;
              BN_free(*(BIGNUM **)(local_c8 + lVar4 + 8));
              lVar4 = lVar4 + -0x10;
            } while (lVar4 != 0);
            lVar4 = 0x30;
            do {
              puStack_f0 = (undefined1 *)0x214e6b;
              BN_free(*(BIGNUM **)((long)&puStack_f0 + lVar4));
              lVar4 = lVar4 + -0x10;
            } while (lVar4 != 0);
            return iVar3;
          }
        }
        iVar3 = 0;
      }
      return iVar3;
    }
    puStack_f0 = (undefined1 *)0x214ed7;
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,800,kFatal,(ostream *)&std::cerr);
    puStack_f0 = (undefined1 *)0x214eec;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT62(local_b8.c_[0].bn_.bn_._2_6_,local_b8.c_[0].bn_.bn_._0_2_),
               "Check failed: (b0) != (-b1) ",0x1c);
  }
  else {
    puStack_f0 = (undefined1 *)0x214e9b;
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,799,kFatal,(ostream *)&std::cerr);
    puStack_f0 = (undefined1 *)0x214eb0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT62(local_b8.c_[0].bn_.bn_._2_6_,local_b8.c_[0].bn_.bn_._0_2_),
               "Check failed: (a0) != (-a1) ",0x1c);
  }
  puStack_f0 = &LAB_00214ef1;
  abort();
}

Assistant:

int CompareEdgeDirections(const S2Point& a0, const S2Point& a1,
                          const S2Point& b0, const S2Point& b1) {
  // Check that no edge consists of antipodal points.  (This catches the most
  // common case -- the full test is in ExactCompareEdgeDirections.)
  S2_DCHECK_NE(a0, -a1);
  S2_DCHECK_NE(b0, -b1);

  int sign = TriageCompareEdgeDirections(a0, a1, b0, b1);
  if (sign != 0) return sign;

  // Optimization for the case where either edge is degenerate.
  if (a0 == a1 || b0 == b1) return 0;

  sign = TriageCompareEdgeDirections(ToLD(a0), ToLD(a1), ToLD(b0), ToLD(b1));
  if (sign != 0) return sign;
  return ExactCompareEdgeDirections(ToExact(a0), ToExact(a1),
                                    ToExact(b0), ToExact(b1));
}